

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O2

void __thiscall
KDReports::ReportPrivate::setPaperSizeFromPrinter(ReportPrivate *this,QSizeF paperSize)

{
  qreal qVar1;
  double w;
  
  if (this->m_layoutWidth <= 0.0) {
    (this->m_paperSize).wd = paperSize.wd;
    (this->m_paperSize).ht = paperSize.ht;
    qVar1 = mmToPixels(this->m_marginLeft + this->m_marginRight);
    w = (this->m_paperSize).wd - qVar1;
    HeaderMap::layoutWithTextWidth(&this->m_headers,w);
    HeaderMap::layoutWithTextWidth(&this->m_footers,w);
    qVar1 = mainTextDocHeight(this);
    (*this->m_layout->_vptr_AbstractReportLayout[7])(w,qVar1);
    this->m_pageContentSizeDirty = false;
    return;
  }
  qt_assert("!wantEndlessPrinting()",
            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
            ,0xbb);
}

Assistant:

bool KDReports::ReportPrivate::wantEndlessPrinting() const
{
    return m_layoutWidth > 0;
}